

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long *plVar1;
  long *plVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->size_ != 0) {
    uVar4 = this->capacity_;
    if (uVar4 < 0x80) {
      if (uVar4 != 0) {
        lVar5 = 0x10;
        uVar3 = 0;
        do {
          if (-1 < this->ctrl_[uVar3]) {
            plVar1 = *(long **)((long)this->slots_ + lVar5 + -0x10);
            plVar2 = (long *)((long)&(this->slots_->_M_dataplus)._M_p + lVar5);
            if (plVar2 != plVar1) {
              operator_delete(plVar1,*plVar2 + 1);
              uVar4 = this->capacity_;
            }
          }
          uVar3 = uVar3 + 1;
          lVar5 = lVar5 + 0x20;
        } while (uVar3 != uVar4);
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar4 + 0x10);
        this->ctrl_[uVar4] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::clear() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}